

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86.cpp
# Opt level: O2

int __thiscall ncnn::ReLU_x86::forward_inplace_int8(ReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  iVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  uVar2 = bottom_top_blob->c;
  fVar1 = (this->super_ReLU).slope;
  if (bottom_top_blob->elempack == 8) {
    if (fVar1 == 0.0) {
      uVar6 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      uVar5 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar5 = uVar6;
      }
      for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
        pvVar3 = bottom_top_blob->data;
        lVar7 = bottom_top_blob->cstep * bottom_top_blob->elemsize * uVar6;
        for (lVar8 = 0; iVar4 != (int)lVar8; lVar8 = lVar8 + 1) {
          if (*(char *)((long)pvVar3 + lVar8 * 8 + lVar7) < '\0') {
            *(undefined1 *)((long)pvVar3 + lVar8 * 8 + lVar7) = 0;
          }
          if (*(char *)((long)pvVar3 + lVar8 * 8 + lVar7 + 1) < '\0') {
            *(undefined1 *)((long)pvVar3 + lVar8 * 8 + lVar7 + 1) = 0;
          }
          if (*(char *)((long)pvVar3 + lVar8 * 8 + lVar7 + 2) < '\0') {
            *(undefined1 *)((long)pvVar3 + lVar8 * 8 + lVar7 + 2) = 0;
          }
          if (*(char *)((long)pvVar3 + lVar8 * 8 + lVar7 + 3) < '\0') {
            *(undefined1 *)((long)pvVar3 + lVar8 * 8 + lVar7 + 3) = 0;
          }
          if (*(char *)((long)pvVar3 + lVar8 * 8 + lVar7 + 4) < '\0') {
            *(undefined1 *)((long)pvVar3 + lVar8 * 8 + lVar7 + 4) = 0;
          }
          if (*(char *)((long)pvVar3 + lVar8 * 8 + lVar7 + 5) < '\0') {
            *(undefined1 *)((long)pvVar3 + lVar8 * 8 + lVar7 + 5) = 0;
          }
          if (*(char *)((long)pvVar3 + lVar8 * 8 + lVar7 + 6) < '\0') {
            *(undefined1 *)((long)pvVar3 + lVar8 * 8 + lVar7 + 6) = 0;
          }
          if (*(char *)((long)pvVar3 + lVar8 * 8 + lVar7 + 7) < '\0') {
            *(undefined1 *)((long)pvVar3 + lVar8 * 8 + lVar7 + 7) = 0;
          }
        }
      }
    }
  }
  else if (fVar1 == 0.0) {
    uVar6 = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      lVar7 = bottom_top_blob->cstep * bottom_top_blob->elemsize * uVar6;
      pvVar3 = bottom_top_blob->data;
      for (lVar8 = 0; iVar4 != (int)lVar8; lVar8 = lVar8 + 1) {
        if (*(char *)((long)pvVar3 + lVar8 + lVar7) < '\0') {
          *(undefined1 *)((long)pvVar3 + lVar8 + lVar7) = 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

int ReLU_x86::forward_inplace_int8(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
    int elempack = bottom_top_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                signed char* ptr = bottom_top_blob.channel(q);

                int i = 0;
                for (; i < size; i++)
                {
                    if (ptr[0] < 0)
                        ptr[0] = 0;
                    if (ptr[1] < 0)
                        ptr[1] = 0;
                    if (ptr[2] < 0)
                        ptr[2] = 0;
                    if (ptr[3] < 0)
                        ptr[3] = 0;
                    if (ptr[4] < 0)
                        ptr[4] = 0;
                    if (ptr[5] < 0)
                        ptr[5] = 0;
                    if (ptr[6] < 0)
                        ptr[6] = 0;
                    if (ptr[7] < 0)
                        ptr[7] = 0;

                    ptr += 8;
                }
            }
        }
        else
        {
            // TODO leakyrelu
        }

        return 0;
    }
#endif // __SSE2__

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            signed char* ptr = bottom_top_blob.channel(q);

            int i = 0;
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr = 0;

                ptr++;
            }
        }
    }
    else
    {
        // TODO leakyrelu
    }

    return 0;
}